

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_distFcnElement.cpp
# Opt level: O2

distFcnElement2d * __thiscall
amrex::LineDistFcnElement2d::newDistFcnElement2d(LineDistFcnElement2d *this)

{
  distFcnElement2d *pdVar1;
  
  pdVar1 = (distFcnElement2d *)operator_new(0x38);
  pdVar1->_vptr_distFcnElement2d = (_func_int **)&PTR_newDistFcnElement2d_007d5010;
  pdVar1[1]._vptr_distFcnElement2d = (_func_int **)0x0;
  pdVar1[2]._vptr_distFcnElement2d = (_func_int **)0x0;
  pdVar1[3]._vptr_distFcnElement2d = (_func_int **)0x0;
  pdVar1[4]._vptr_distFcnElement2d = (_func_int **)0x0;
  pdVar1[5]._vptr_distFcnElement2d = (_func_int **)0x0;
  pdVar1[6]._vptr_distFcnElement2d = (_func_int **)0x0;
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)(pdVar1 + 1),&this->control_points_x);
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)(pdVar1 + 4),&this->control_points_y);
  return pdVar1;
}

Assistant:

distFcnElement2d* LineDistFcnElement2d::newDistFcnElement2d() const {
  LineDistFcnElement2d* newLine = new LineDistFcnElement2d();
  newLine->control_points_x = control_points_x;
  newLine->control_points_y = control_points_y;
  return static_cast<distFcnElement2d*>(newLine);
}